

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarHelpers.cpp
# Opt level: O0

optional<unsigned_long> tools::xar::read_sysfs_cgroup_inode(char *filename)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long lVar4;
  size_type sVar5;
  reference pvVar6;
  const_iterator ppcVar7;
  char *pcVar8;
  size_t in_RCX;
  undefined8 extraout_RDX;
  ssize_t in_R9;
  optional<unsigned_long> oVar9;
  string_view s;
  undefined1 local_1f8 [8];
  stat st;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  char **candidate;
  const_iterator __end2;
  const_iterator __begin2;
  char *local_e0;
  initializer_list<const_char_*> local_d8;
  initializer_list<const_char_*> *local_c8;
  initializer_list<const_char_*> *__range2;
  size_type newline_pos;
  undefined1 local_b0 [16];
  xar local_99;
  undefined1 local_98 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  components;
  string local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> contents;
  undefined1 local_48 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  maybe_contents;
  char *filename_local;
  bool local_10;
  
  maybe_contents.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = filename;
  (anonymous_namespace)::read_file_prefix_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_48,(_anonymous_namespace_ *)filename,(char *)0x1000,in_RCX);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_48);
  if (bVar1) {
    pbVar3 = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_48);
    std::__cxx11::string::string(local_70,(string *)pbVar3);
    lVar4 = std::__cxx11::string::size();
    if (lVar4 == 0x1000) {
      std::optional<unsigned_long>::optional((optional<unsigned_long> *)&filename_local);
      contents.field_2._8_4_ = 1;
    }
    else {
      local_99 = (xar)0x3a;
      local_b0 = std::__cxx11::string::operator_cast_to_basic_string_view(local_70);
      s._M_str = (char *)0xffffffffffffffff;
      s._M_len = local_b0._8_8_;
      split<char>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_98,&local_99,local_b0._0_8_,s,in_R9);
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_98);
      if (sVar5 < 3) {
        std::optional<unsigned_long>::optional((optional<unsigned_long> *)&filename_local);
        contents.field_2._8_4_ = 1;
      }
      else {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_98,2);
        __range2 = (initializer_list<const_char_*> *)std::__cxx11::string::find((char)pvVar6,10);
        if (__range2 != (initializer_list<const_char_*> *)0xffffffffffffffff) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_98,2);
          std::__cxx11::string::erase((ulong)pvVar6,(ulong)__range2);
        }
        __begin2 = (const_iterator)anon_var_dwarf_13c5a;
        local_e0 = "/cgroup2";
        local_d8._M_array = (iterator)&__begin2;
        local_d8._M_len = 2;
        local_c8 = &local_d8;
        __end2 = std::initializer_list<const_char_*>::begin(local_c8);
        ppcVar7 = std::initializer_list<const_char_*>::end(local_c8);
        for (; __end2 != ppcVar7; __end2 = __end2 + 1) {
          path.field_2._8_8_ = __end2;
          pcVar8 = *__end2;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_160,pcVar8,
                     (allocator<char> *)((long)st.__glibc_reserved + 0x17));
          std::operator+(&local_140,&local_160,"/");
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_98,2);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_120,&local_140,pvVar6);
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::~string((string *)&local_160);
          std::allocator<char>::~allocator((allocator<char> *)((long)st.__glibc_reserved + 0x17));
          pcVar8 = (char *)std::__cxx11::string::c_str();
          iVar2 = stat(pcVar8,(stat *)local_1f8);
          if (iVar2 == 0) {
            std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                      ((optional<unsigned_long> *)&filename_local,&st.st_dev);
          }
          contents.field_2._9_3_ = 0;
          contents.field_2._M_local_buf[8] = iVar2 == 0;
          std::__cxx11::string::~string((string *)local_120);
          if (contents.field_2._8_4_ != 0) goto LAB_0010dff4;
        }
        std::optional<unsigned_long>::optional((optional<unsigned_long> *)&filename_local);
        contents.field_2._8_4_ = 1;
      }
LAB_0010dff4:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_98);
    }
    std::__cxx11::string::~string(local_70);
  }
  else {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&filename_local);
    contents.field_2._8_4_ = 1;
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_48);
  oVar9.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  oVar9.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = local_10;
  oVar9.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)filename_local;
  return (optional<unsigned_long>)
         oVar9.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<ino_t> read_sysfs_cgroup_inode(const char* filename) {
  const auto maybe_contents = read_file_prefix(filename, 4096);
  if (!maybe_contents) {
    return std::nullopt;
  }
  const auto contents = *maybe_contents;
  if (contents.size() == 4096) {
    return std::nullopt;
  }

  // File contents are a colon-separated triplet.  We want the last
  // field, and to toss out the trailing newline.
  auto components = tools::xar::split(':', contents);
  if (components.size() < 3) {
    return std::nullopt;
  }
  auto newline_pos = components[2].find('\n');
  if (newline_pos != std::string::npos) {
    components[2].erase(newline_pos);
  }

  // /sys/fs/cgroup is the typical mount point for the cgroup2
  // filesystem, but it is not guaranteed.  In some FB environments
  // we've historically used /cgroup2 instead.
  for (auto& candidate : {"/sys/fs/cgroup", "/cgroup2"}) {
    auto path = std::string(candidate) + "/" + components[2];
    struct stat st;
    if (stat(path.c_str(), &st) == 0) {
      return st.st_ino;
    }
  }

  return std::nullopt;
}